

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_twin_messenger.c
# Opt level: O3

void on_amqp_send_complete_callback
               (AMQP_MESSENGER_SEND_RESULT result,AMQP_MESSENGER_REASON reason,void *context)

{
  undefined8 uVar1;
  undefined8 uVar2;
  long lVar3;
  int iVar4;
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  undefined4 uVar8;
  
  if (context == (void *)0x0) {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                 ,"on_amqp_send_complete_callback",0x378,1,"Invalid argument (context is NULL)");
      return;
    }
  }
  else if (result != AMQP_MESSENGER_SEND_RESULT_SUCCESS) {
    if (*context == 3) {
      if (*(code **)((long)context + 0x18) != (code *)0x0) {
        (**(code **)((long)context + 0x18))(1,0,0,*(undefined8 *)((long)context + 0x20));
      }
    }
    else if (*context == 1) {
      if (*(long *)((long)context + 0x18) != 0) {
        if (AMQP_MESSENGER_SEND_RESULT_CANCELLED < result) {
          UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
          if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) {
            result = AMQP_MESSENGER_SEND_RESULT_ERROR;
          }
          else {
            pcVar5 = AMQP_MESSENGER_SEND_RESULTStrings(result);
            result = AMQP_MESSENGER_SEND_RESULT_ERROR;
            (*UNRECOVERED_JUMPTABLE)
                      (AZ_LOG_ERROR,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                       ,"get_twin_messenger_result_from",0x34c,1,"Unrecognized enum value %s",pcVar5
                      );
          }
        }
        if (reason < (AMQP_MESSENGER_REASON_MESSENGER_DESTROYED|AMQP_MESSENGER_REASON_CANNOT_PARSE))
        {
          uVar8 = *(undefined4 *)(&DAT_0019e7ac + (ulong)reason * 4);
        }
        else {
          UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
          if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) {
            uVar8 = 0;
          }
          else {
            pcVar5 = AMQP_MESSENGER_REASONStrings(reason);
            uVar8 = 0;
            (*UNRECOVERED_JUMPTABLE)
                      (AZ_LOG_ERROR,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                       ,"get_twin_messenger_reason_from",0x36a,1,"Unrecognized enum value %s (%d)",
                       pcVar5,(ulong)reason);
          }
        }
        (**(code **)((long)context + 0x18))(result,uVar8,0,*(undefined8 *)((long)context + 0x20));
      }
    }
    else if (reason != AMQP_MESSENGER_REASON_MESSENGER_DESTROYED) {
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
        uVar1 = *(undefined8 *)(*(long *)((long)context + 8) + 0x10);
        if ((ulong)*context < 6) {
          pcVar5 = TWIN_OPERATION_TYPEStringStorage[*context];
        }
        else {
          pcVar5 = "NULL";
        }
        uVar2 = *(undefined8 *)((long)context + 0x10);
        pcVar6 = AMQP_MESSENGER_SEND_RESULTStrings(result);
        pcVar7 = AMQP_MESSENGER_REASONStrings(reason);
        (*UNRECOVERED_JUMPTABLE)
                  (AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                   ,"on_amqp_send_complete_callback",0x39a,1,
                   "Failed sending TWIN operation request (%s, %s, %s, %s, %s)",uVar1,pcVar5,uVar2,
                   pcVar6,pcVar7);
      }
      if (((*context == 4) || (*context == 2)) &&
         (lVar3 = *(long *)((long)context + 8), *(int *)(lVar3 + 0x50) == 3)) {
        *(undefined4 *)(lVar3 + 0x50) = 2;
        *(long *)(lVar3 + 0x58) = *(long *)(lVar3 + 0x58) + 1;
      }
    }
    iVar4 = remove_twin_operation_context_from_queue((TWIN_OPERATION_CONTEXT *)context);
    if (iVar4 == 0) {
      free(*(void **)((long)context + 0x10));
      free(context);
      return;
    }
    lVar3 = *(long *)((long)context + 8);
    iVar4 = *(int *)(lVar3 + 0x28);
    if (iVar4 != 4) {
      *(undefined4 *)(lVar3 + 0x28) = 4;
      if (*(code **)(lVar3 + 0x40) != (code *)0x0) {
        (**(code **)(lVar3 + 0x40))(*(undefined8 *)(lVar3 + 0x48),iVar4,4);
        return;
      }
    }
  }
  return;
}

Assistant:

static void on_amqp_send_complete_callback(AMQP_MESSENGER_SEND_RESULT result, AMQP_MESSENGER_REASON reason, void* context)
{
    // Applicable to TWIN requests for reported state PATCH, GET, PUT, DELETE.

    if (context == NULL)
    {
        LogError("Invalid argument (context is NULL)");
    }
    else
    {
        TWIN_OPERATION_CONTEXT* twin_op_ctx = (TWIN_OPERATION_CONTEXT*)context;

        if (result != AMQP_MESSENGER_SEND_RESULT_SUCCESS)
        {
            if (twin_op_ctx->type == TWIN_OPERATION_TYPE_PATCH)
            {
                if (twin_op_ctx->cb.reported_properties.callback != NULL)
                {
                    TWIN_REPORT_STATE_RESULT callback_result;
                    TWIN_REPORT_STATE_REASON callback_reason;

                    callback_result = get_twin_messenger_result_from(result);
                    callback_reason = get_twin_messenger_reason_from(reason);

                    twin_op_ctx->cb.reported_properties.callback(callback_result, callback_reason, 0, (void*)twin_op_ctx->cb.reported_properties.context);
                }
            }
            else if (twin_op_ctx->type == TWIN_OPERATION_TYPE_GET_ON_DEMAND)
            {
                if (twin_op_ctx->cb.get_twin.callback != NULL)
                {
                    twin_op_ctx->cb.get_twin.callback(TWIN_UPDATE_TYPE_COMPLETE, NULL, 0, (void*)twin_op_ctx->cb.get_twin.context);
                }
            }
            else if (reason != AMQP_MESSENGER_REASON_MESSENGER_DESTROYED)
            {
                LogError("Failed sending TWIN operation request (%s, %s, %s, %s, %s)",
                    twin_op_ctx->msgr->device_id,
                    MU_ENUM_TO_STRING(TWIN_OPERATION_TYPE, twin_op_ctx->type),
                    twin_op_ctx->correlation_id,
                    MU_ENUM_TO_STRING(AMQP_MESSENGER_SEND_RESULT, result), MU_ENUM_TO_STRING(AMQP_MESSENGER_REASON, reason));

                if (twin_op_ctx->type == TWIN_OPERATION_TYPE_GET &&
                    twin_op_ctx->msgr->subscription_state == TWIN_SUBSCRIPTION_STATE_GETTING_COMPLETE_PROPERTIES)
                {
                    twin_op_ctx->msgr->subscription_state = TWIN_SUBSCRIPTION_STATE_GET_COMPLETE_PROPERTIES;
                    twin_op_ctx->msgr->subscription_error_count++;
                }
                else if (twin_op_ctx->type == TWIN_OPERATION_TYPE_PUT &&
                    twin_op_ctx->msgr->subscription_state == TWIN_SUBSCRIPTION_STATE_GETTING_COMPLETE_PROPERTIES)
                {
                    twin_op_ctx->msgr->subscription_state = TWIN_SUBSCRIPTION_STATE_GET_COMPLETE_PROPERTIES;
                    twin_op_ctx->msgr->subscription_error_count++;
                }
            }

            if (remove_twin_operation_context_from_queue(twin_op_ctx) != RESULT_OK)
            {
                update_state(twin_op_ctx->msgr, TWIN_MESSENGER_STATE_ERROR);
            }
            else
            {
                destroy_twin_operation_context(twin_op_ctx);
            }
        }
    }
}